

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O3

RC __thiscall PF_FileHandle::FlushPages(PF_FileHandle *this)

{
  RC RVar1;
  __off_t _Var2;
  ssize_t sVar3;
  
  if (this->bFileOpen == 0) {
    RVar1 = 5;
  }
  else {
    if (this->bHdrChanged == 0) {
LAB_0010621f:
      RVar1 = PF_BufferMgr::FlushPages(this->pBufferMgr,this->unixfd);
      return RVar1;
    }
    _Var2 = lseek(this->unixfd,0,0);
    RVar1 = -0xb;
    if (-1 < _Var2) {
      sVar3 = write(this->unixfd,&this->hdr,8);
      if ((-1 < (int)(uint)sVar3) && (RVar1 = -6, ((uint)sVar3 & 0x7fffffff) == 8)) {
        this->bHdrChanged = 0;
        goto LAB_0010621f;
      }
    }
  }
  return RVar1;
}

Assistant:

RC PF_FileHandle::FlushPages() const
{
   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // If the file header has changed, write it back to the file
   if (bHdrChanged) {

      // First seek to the appropriate place
      if (lseek(unixfd, 0, L_SET) < 0)
         return (PF_UNIX);

      // Write header
      int numBytes = write(unixfd,
            (char *)&hdr,
            sizeof(PF_FileHdr));
      if (numBytes < 0)
         return (PF_UNIX);
      if (numBytes != sizeof(PF_FileHdr))
         return (PF_HDRWRITE);

      // This function is declared const, but we need to change the
      // bHdrChanged variable.  Cast away the constness
      PF_FileHandle *dummy = (PF_FileHandle *)this;
      dummy->bHdrChanged = FALSE;
   }

   // Tell Buffer Manager to flush pages
   return (pBufferMgr->FlushPages(unixfd));
}